

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double dirichlet_pdf(double *x,int n,double *a)

{
  double dVar1;
  double dVar2;
  double x_sum;
  double tol;
  double pdf;
  int i;
  double a_sum;
  double a_prod;
  double *a_local;
  int n_local;
  double *x_local;
  
  pdf._4_4_ = 0;
  while( true ) {
    if (n <= pdf._4_4_) {
      dVar1 = r8vec_sum(n,x);
      if (0.0001 < ABS(dVar1 - 1.0)) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  SUM X(I) =/= 1.\n");
        exit(1);
      }
      dVar1 = r8vec_sum(n,a);
      a_sum = 1.0;
      for (pdf._4_4_ = 0; pdf._4_4_ < n; pdf._4_4_ = pdf._4_4_ + 1) {
        dVar2 = tgamma(a[pdf._4_4_]);
        a_sum = a_sum * dVar2;
      }
      dVar1 = tgamma(dVar1);
      tol = dVar1 / a_sum;
      for (pdf._4_4_ = 0; pdf._4_4_ < n; pdf._4_4_ = pdf._4_4_ + 1) {
        dVar1 = pow(x[pdf._4_4_],a[pdf._4_4_] - 1.0);
        tol = tol * dVar1;
      }
      return tol;
    }
    if (x[pdf._4_4_] <= 0.0) break;
    pdf._4_4_ = pdf._4_4_ + 1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  X(I) <= 0.\n");
  exit(1);
}

Assistant:

double dirichlet_pdf ( double x[], int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_PDF evaluates the Dirichlet PDF.
//
//  Discussion:
//
//    PDF(N,A;X) = Product ( 1 <= I <= N ) X(I)^( A(I) - 1 )
//      * Gamma ( A_SUM ) / A_PROD
//
//    where
//
//      0 < A(I) for all I;
//      0 <= X(I) for all I;
//      Sum ( 1 <= I <= N ) X(I) = 1;
//      A_SUM = Sum ( 1 <= I <= N ) A(I).
//      A_PROD = Product ( 1 <= I <= N ) Gamma ( A(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X(N), the argument of the PDF.  Each X(I) should
//    be greater than 0.0, and the X(I)'s must add up to 1.0.
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Output, double PDF, the value of the PDF.
//
{
  double a_prod;
  double a_sum;
  int i;
  double pdf;
  double tol = 0.0001;
  double x_sum;

  for ( i = 0; i < n; i++ )
  {
    if ( x[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_PDF - Fatal error!\n";
      cerr << "  X(I) <= 0.\n";
      exit ( 1 );
    }
  }

  x_sum = r8vec_sum ( n, x );

  if ( tol < fabs ( x_sum - 1.0 ) )
  {
    cerr << " \n";
    cerr << "DIRICHLET_PDF - Fatal error!\n";
    cerr << "  SUM X(I) =/= 1.\n";
    exit ( 1 );
  }

  a_sum = r8vec_sum ( n, a );

  a_prod = 1.0;
  for ( i = 0; i < n; i++ )
  {
    a_prod = a_prod * tgamma ( a[i] );
  }

  pdf = tgamma ( a_sum ) / a_prod;

  for ( i = 0; i < n; i++ )
  {
    pdf = pdf * pow ( x[i], a[i] - 1.0 );
  }

  return pdf;
}